

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&),_void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
::call(cni_helper<void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&),_void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
       *this,vector *args)

{
  size_type sVar1;
  runtime_error *this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  vector *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  
  this_01 = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::operator+(in_RDI,(char *)this_00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    cs::runtime_error::runtime_error(this_00,in_stack_ffffffffffffff08);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  cni_helper<void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&),void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&)>
  ::_call<0,1,2>((cni_helper<void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&),_void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
                  *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_RSI,
                 (sequence<0,_1,_2> *)this_01);
  any::any<cs::pointer>((any *)this_01,(pointer *)in_RDI);
  return (any)(proxy *)this_01;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result);
			return cs::null_pointer;
		}